

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glFrontFace(QOpenGLFunctions *this,GLenum mode)

{
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0xa0))(in_ESI);
  return;
}

Assistant:

inline void QOpenGLFunctions::glFrontFace(GLenum mode)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glFrontFace(mode);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.FrontFace(mode);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}